

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_conv_2d_dw_direct
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int stride0,int stride1,int pad0,int pad1
          ,int dilation0,int dilation1)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  size_t sVar3;
  int64_t iVar4;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int32_t params [6];
  int in_stack_00000018;
  int64_t type_size;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffff88;
  ggml_type in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  if (in_RSI->ne[2] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xfea,"GGML_ASSERT(%s) failed","a->ne[2] == 1");
  }
  if (in_RSI->ne[3] == in_RDX->ne[2]) {
    ggml_calc_conv_output_size(in_RDX->ne[0],in_RSI->ne[0],in_ECX,in_R9D,params[4]);
    ggml_calc_conv_output_size(in_RDX->ne[1],in_RSI->ne[1],in_R8D,params[2],in_stack_00000018);
    pgVar2 = ggml_new_tensor((ggml_context *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,(int64_t *)0x150e7a
                            );
    _Var1 = ggml_is_contiguous_channels
                      ((ggml_tensor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    if (_Var1) {
      sVar3 = ggml_type_size(pgVar2->type);
      iVar4 = ggml_blck_size(pgVar2->type);
      if (iVar4 != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
                   ,0xff7,"GGML_ASSERT(%s) failed","ggml_blck_size(result->type) == 1");
      }
      pgVar2->nb[0] = pgVar2->ne[2] * sVar3;
      pgVar2->nb[1] = pgVar2->ne[0] * pgVar2->nb[0];
      pgVar2->nb[2] = sVar3;
    }
    ggml_set_op_params((ggml_tensor *)CONCAT44(params[2],in_R9D),(void *)CONCAT44(in_R8D,in_ECX),
                       0x150f62);
    pgVar2->op = GGML_OP_CONV_2D_DW;
    pgVar2->src[0] = in_RSI;
    pgVar2->src[1] = in_RDX;
    return pgVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0xfeb,"GGML_ASSERT(%s) failed","a->ne[3] == b->ne[2]");
}

Assistant:

struct ggml_tensor * ggml_conv_2d_dw_direct(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   stride0,
        int                   stride1,
        int                   pad0,
        int                   pad1,
        int                   dilation0,
        int                   dilation1) {
    GGML_ASSERT(a->ne[2] == 1);
    GGML_ASSERT(a->ne[3] == b->ne[2]);
    int64_t ne[4];
    ne[0] = ggml_calc_conv_output_size(b->ne[0], a->ne[0], stride0, pad0, dilation0);
    ne[1] = ggml_calc_conv_output_size(b->ne[1], a->ne[1], stride1, pad1, dilation1);
    ne[2] = b->ne[2];
    ne[3] = b->ne[3];

    struct ggml_tensor * result = ggml_new_tensor(ctx, b->type, 4, ne);

    if (ggml_is_contiguous_channels(b)) {
        // Result will be permuted the same way as input (CWHN order)
        const int64_t type_size = ggml_type_size(result->type);
        GGML_ASSERT(ggml_blck_size(result->type) == 1);
        result->nb[0] = result->ne[2] * type_size;
        result->nb[1] = result->ne[0] * result->nb[0];
        result->nb[2] = type_size;
    }

    int32_t params[] = { stride0, stride1, pad0, pad1, dilation0, dilation1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_2D_DW;
    result->src[0] = a;
    result->src[1] = b;
    return result;
}